

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O2

void google::protobuf::compiler::java::WriteDocCommentBody<google::protobuf::FieldDescriptor>
               (Printer *printer,FieldDescriptor *descriptor,Options *options,bool kdoc)

{
  bool bVar1;
  SourceLocation location;
  SourceLocation local_d0;
  Options local_68;
  
  local_d0.leading_comments._M_dataplus._M_p = (pointer)&local_d0.leading_comments.field_2;
  local_d0.leading_comments._M_string_length = 0;
  local_d0.leading_comments.field_2._M_local_buf[0] = '\0';
  local_d0.trailing_comments._M_dataplus._M_p = (pointer)&local_d0.trailing_comments.field_2;
  local_d0.trailing_comments._M_string_length = 0;
  local_d0.trailing_comments.field_2._M_local_buf[0] = '\0';
  local_d0.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = FieldDescriptor::GetSourceLocation(descriptor,&local_d0);
  if (bVar1) {
    Options::Options(&local_68,options);
    WriteDocCommentBodyForLocation(printer,&local_d0,&local_68,kdoc);
    Options::~Options(&local_68);
  }
  SourceLocation::~SourceLocation(&local_d0);
  return;
}

Assistant:

static void WriteDocCommentBody(io::Printer* printer,
                                const DescriptorType* descriptor,
                                const Options options, const bool kdoc) {
  SourceLocation location;
  if (descriptor->GetSourceLocation(&location)) {
    WriteDocCommentBodyForLocation(printer, location, options, kdoc);
  }
}